

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O2

void Abc_TgSimpleEnumeration(Abc_TgMan_t *pMan)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  char *pcVar6;
  int idx;
  ulong uVar7;
  long lVar8;
  byte bVar9;
  int iVar10;
  int *piVar11;
  uint uVar12;
  int pGid [16];
  
  uVar3 = (ulong)(uint)pMan->nGroups;
  if (pMan->nGroups < 1) {
    uVar3 = 0;
  }
  iVar10 = 0;
  for (uVar7 = 0; uVar7 != uVar3; uVar7 = uVar7 + 1) {
    bVar9 = pMan->pGroup[uVar7].nGVars;
    if ((char)bVar9 < '\x01') {
      bVar9 = 0;
    }
    for (lVar8 = (long)iVar10; (int)(iVar10 + (uint)bVar9) != lVar8; lVar8 = lVar8 + 1) {
      pGid[lVar8] = (int)uVar7;
    }
    iVar10 = iVar10 + (uint)bVar9;
  }
  if (iVar10 != pMan->nGVars) {
    __assert_fail("k == pMan->nGVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                  ,0x866,"void Abc_TgSimpleEnumeration(Abc_TgMan_t *)");
  }
  iVar10 = 0;
  do {
    if (iVar10 == 5) {
LAB_0042fbef:
      iVar10 = Abc_TgCannonVerify(pMan);
      if (iVar10 != 0) {
        return;
      }
      __assert_fail("Abc_TgCannonVerify(pMan)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                    ,0x87a,"void Abc_TgSimpleEnumeration(Abc_TgMan_t *)");
    }
    uVar5 = pMan->nGVars - 2;
    piVar11 = pGid + (pMan->nGVars - 1);
    uVar12 = 0;
    while( true ) {
      uVar2 = 1;
      if ((int)uVar5 < 0) break;
      if (pGid[uVar5] == *piVar11) {
        if (pGid[uVar5] < 1) {
          uVar2 = (uint)(pMan->fPhased != 0);
        }
        uVar2 = Abc_TgSymGroupPerm(pMan,uVar5,uVar2);
        uVar12 = uVar12 | uVar2;
      }
      uVar5 = uVar5 - 1;
      piVar11 = piVar11 + -1;
    }
    lVar8 = 1;
LAB_0042fb4c:
    idx = (int)lVar8 + -1;
    lVar4 = lVar8;
    while (lVar4 < (long)pMan->nGVars + -1) {
      piVar11 = pGid + lVar4;
      lVar8 = lVar4 + 1;
      idx = idx + 1;
      lVar1 = lVar4 + 1;
      lVar4 = lVar8;
      if (*piVar11 == pGid[lVar1]) goto code_r0x0042fb72;
    }
    uVar5 = pMan->nVars;
    while (0 < (int)uVar5) {
      uVar5 = uVar5 - 1;
      if (pMan->symPhase[uVar5] != '\0') {
        uVar2 = Abc_TgPermPhase(pMan,uVar5);
        uVar12 = uVar12 | uVar2;
      }
    }
    pcVar6 = pMan->symPhase;
    for (lVar8 = 1; pcVar6 = pcVar6 + 1, lVar8 < pMan->nVars; lVar8 = lVar8 + 1) {
      if (*pcVar6 != '\0') {
        uVar5 = Abc_TgPermPhase(pMan,(int)lVar8);
        uVar12 = uVar12 | uVar5;
      }
    }
    iVar10 = iVar10 + 1;
    if (uVar12 == 0) goto LAB_0042fbef;
  } while( true );
code_r0x0042fb72:
  uVar5 = uVar2;
  if (*piVar11 < 1) {
    uVar5 = (uint)(pMan->fPhased != 0);
  }
  uVar5 = Abc_TgSymGroupPerm(pMan,idx,uVar5);
  uVar12 = uVar12 | uVar5;
  goto LAB_0042fb4c;
}

Assistant:

static void Abc_TgSimpleEnumeration(Abc_TgMan_t * pMan)
{
    int i, j, k;
    int pGid[16];

    for (k = j = 0; j < pMan->nGroups; j++)
        for (i = 0; i < pMan->pGroup[j].nGVars; i++, k++)
            pGid[k] = j;
    assert(k == pMan->nGVars);

    for (k = 0; k < 5; k++)
    {
        int fChanges = 0;
        for (i = pMan->nGVars - 2; i >= 0; i--)
            if (pGid[i] == pGid[i + 1])
                fChanges |= Abc_TgSymGroupPerm(pMan, i, pGid[i] > 0 || pMan->fPhased);
        for (i = 1; i < pMan->nGVars - 1; i++)
            if (pGid[i] == pGid[i + 1])
                fChanges |= Abc_TgSymGroupPerm(pMan, i, pGid[i] > 0 || pMan->fPhased);

        for (i = pMan->nVars - 1; i >= 0; i--)
            if (pMan->symPhase[i])
                fChanges |= Abc_TgPermPhase(pMan, i);
        for (i = 1; i < pMan->nVars; i++)
            if (pMan->symPhase[i])
                fChanges |= Abc_TgPermPhase(pMan, i);
        if (!fChanges) break;
    }
    assert(Abc_TgCannonVerify(pMan));
}